

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O3

bool __thiscall Type::AddSizeVar(Type *this,Output *out_cc,Env *env)

{
  int iVar1;
  ID *this_00;
  ID *pIVar2;
  Field *this_01;
  Type *pTVar3;
  string local_48;
  
  if ((this->size_var_field_ == (Field *)0x0) ||
     (pTVar3 = (Type *)this->size_var_field_->id_, pTVar3 == (Type *)0x0)) {
    iVar1 = (*(this->super_DataDepElement)._vptr_DataDepElement[0x13])(this,env);
    if (iVar1 < 0) {
      this_00 = (ID *)operator_new(0x78);
      pIVar2 = this->value_var_;
      if (pIVar2 == (ID *)0x0) {
        pIVar2 = this->type_decl_id_;
      }
      strfmt_abi_cxx11_(&local_48,"%s__size",(pIVar2->name)._M_dataplus._M_p);
      ID::ID(this_00,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (FLAGS_pac_debug == true) {
        fprintf(_stderr,"adding size var `%s\' to env %p\n",(this_00->name)._M_dataplus._M_p,env);
      }
      this_01 = (Field *)operator_new(0xa0);
      pTVar3 = Clone(&extern_type_int->super_Type);
      Field::Field(this_01,TEMP_VAR_FIELD,0,this_00,pTVar3);
      (this_01->super_DataDepElement)._vptr_DataDepElement = (_func_int **)&PTR__Field_00144208;
      this->size_var_field_ = this_01;
      Field::Prepare(this_01,env);
      (*(this->size_var_field_->super_DataDepElement)._vptr_DataDepElement[7])
                (this->size_var_field_,out_cc,env);
      return true;
    }
  }
  else if (FLAGS_pac_debug) {
    AddSizeVar(pTVar3);
  }
  return false;
}

Assistant:

bool Type::AddSizeVar(Output* out_cc, Env* env)
	{
	if ( size_var() )
		{
		DEBUG_MSG("size var `%s' already added\n", size_var()->Name());
		ASSERT(env->Evaluated(size_var()));
		return false;
		}

	if ( StaticSize(env) >= 0 )
		return false;

	ASSERT(! incremental_input());

	ID* size_var_id = new ID(
		strfmt("%s__size", value_var() ? value_var()->Name() : decl_id()->Name()));

	DEBUG_MSG("adding size var `%s' to env %p\n", size_var_id->Name(), env);

	size_var_field_ = new TempVarField(size_var_id, extern_type_int->Clone());
	size_var_field_->Prepare(env);
	size_var_field_->GenTempDecls(out_cc, env);

	return true;
	}